

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2RenderUtil.cpp
# Opt level: O3

void deqp::egl::gles2::clear(Functions *gl,int x,int y,int width,int height,Vec4 *color)

{
  (*gl->enable)(0xc11);
  (*gl->scissor)(x,y,width,height);
  (*gl->clearColor)(color->m_data[0],color->m_data[1],color->m_data[2],color->m_data[3]);
  (*gl->clear)(0x4000);
  (*gl->disable)(0xc11);
  return;
}

Assistant:

void clear (const glw::Functions& gl, int x, int y, int width, int height, const tcu::Vec4& color)
{
	gl.enable(GL_SCISSOR_TEST);
	gl.scissor(x, y, width, height);
	gl.clearColor(color.x(), color.y(), color.z(), color.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.disable(GL_SCISSOR_TEST);
}